

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpp_tree_handler.c
# Opt level: O1

ion_status_t bpptree_delete(ion_dictionary_t *dictionary,ion_key_t key)

{
  ion_dictionary_parent_t *piVar1;
  ion_status_t iVar2;
  ion_err_t iVar3;
  ion_bpp_err_t iVar4;
  ion_file_offset_t offset;
  undefined4 local_18;
  ion_result_count_t iStack_14;
  ion_file_offset_t local_10;
  
  iStack_14 = 0;
  piVar1 = dictionary->instance;
  iVar4 = b_delete(*(ion_bpp_handle_t *)(piVar1 + 1),key,&local_10);
  iVar3 = '\x01';
  if (iVar4 != bErrKeyNotFound) {
    iVar3 = lfb_delete_all((ion_lfb_t *)&piVar1[1].record.value_size,local_10,&iStack_14);
  }
  local_18 = CONCAT31(local_18._1_3_,iVar3);
  iVar2.count = iStack_14;
  iVar2._0_4_ = local_18;
  return iVar2;
}

Assistant:

ion_status_t
bpptree_delete(
	ion_dictionary_t	*dictionary,
	ion_key_t			key
) {
	ion_bpptree_t		*bpptree;
	ion_bpp_err_t		bErr;
	ion_file_offset_t	offset;
	ion_status_t		status;

	status	= ION_STATUS_INITIALIZE;

	bpptree = (ion_bpptree_t *) dictionary->instance;

	bErr	= b_delete(bpptree->tree, key, &offset);

	if (bErrKeyNotFound != bErr) {
		status.error = lfb_delete_all(&(bpptree->values), offset, &(status.count));
	}
	else {
		status.error = err_item_not_found;
	}

	return status;
}